

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fatcat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  unsigned_long_long uVar9;
  undefined8 uVar10;
  string *this;
  char *pcVar11;
  ostream *poVar12;
  EVP_PKEY_CTX *ctx;
  string error;
  string data;
  undefined1 local_7d0 [8];
  FatEntry entry_1;
  undefined1 local_700 [8];
  FatPath path_2;
  FatDiff diff_1;
  int prev;
  string local_698;
  FatBackup local_678;
  FatBackup backupSystem;
  FatSearch search;
  FatFix fix;
  FatChains chains_2;
  unsigned_long_long size_1;
  FatChains chains_1;
  bool isContiguous;
  int next2;
  int next1;
  longlong addr;
  FatDiff diff;
  undefined1 local_4f0 [8];
  FatExtract extract_1;
  undefined1 local_498 [8];
  FatPath path_1;
  undefined1 local_440 [8];
  FatPath path;
  string local_400;
  undefined1 local_3e0 [8];
  FatSystem fat;
  value_type local_258;
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [55];
  allocator<char> local_159;
  string local_158 [32];
  OutputFormatType local_138;
  byte local_132;
  byte local_131;
  OutputFormatType outputFormat;
  bool findEntry;
  bool attributesProvided;
  int attributes;
  bool sizeProvided;
  bool clusterProvided;
  string entryPath;
  bool entry;
  bool fixReachable;
  bool zero;
  bool scramble;
  uint table;
  uint value;
  bool hasValue;
  bool merge;
  bool writeNext;
  string backupFile;
  string local_d0 [3];
  bool patch;
  bool backup;
  bool chains;
  bool address;
  bool compare;
  string extractDirectory;
  uint local_a8;
  bool extract;
  bool listDeleted;
  uint cluster;
  bool clusterRead;
  string readPath;
  uint local_78;
  bool readFlag;
  uint listCluster;
  bool listClusterFlag;
  string listPath;
  bool listFlag;
  bool infoFlag;
  unsigned_long_long uStack_48;
  uint size;
  unsigned_long_long globalOffset;
  char *pcStack_38;
  int index;
  char *image;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  char **argv_local;
  int argc_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&image);
  pcStack_38 = (char *)0x0;
  uStack_48 = 0;
  listPath.field_2._12_4_ = 0xffffffff;
  listPath.field_2._M_local_buf[0xb] = '\0';
  listPath.field_2._M_local_buf[10] = '\0';
  std::__cxx11::string::string((string *)&listCluster);
  bVar5 = false;
  readPath.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&cluster);
  bVar1 = false;
  local_a8 = 0;
  extractDirectory.field_2._M_local_buf[0xf] = '\0';
  extractDirectory.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string(local_d0);
  backupFile.field_2._M_local_buf[0xf] = '\0';
  backupFile.field_2._M_local_buf[0xe] = '\0';
  backupFile.field_2._M_local_buf[0xd] = '\0';
  backupFile.field_2._M_local_buf[0xc] = '\0';
  backupFile.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::string((string *)&value);
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  entryPath.field_2._12_4_ = 0;
  entryPath.field_2._M_local_buf[0xb] = '\0';
  entryPath.field_2._M_local_buf[10] = '\0';
  entryPath.field_2._M_local_buf[9] = '\0';
  entryPath.field_2._M_local_buf[8] = '\0';
  std::__cxx11::string::string((string *)&attributes);
  attributesProvided = false;
  findEntry = false;
  outputFormat = Default;
  local_131 = 0;
  local_132 = 0;
  local_138 = Default;
  while (iVar6 = getopt(argc,(char **)arguments.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        "il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:"), pcVar11 = _optarg,
        iVar6 != -1) {
    switch(iVar6) {
    case 0x32:
      backupFile.field_2._M_local_buf[0xf] = '\x01';
      break;
    case 0x40:
      backupFile.field_2._M_local_buf[0xe] = '\x01';
      local_a8 = atoi(_optarg);
      break;
    case 0x46:
      iVar6 = strcmp(_optarg,"json");
      if (iVar6 == 0) {
        local_138 = Json;
      }
      else {
        iVar6 = strcmp(_optarg,"default");
        if (iVar6 == 0) {
          local_138 = Default;
        }
        else {
          usage();
        }
      }
      break;
    case 0x4c:
      bVar5 = true;
      local_78 = atoi(_optarg);
      break;
    case 0x4f:
      uStack_48 = atoll(_optarg);
      break;
    case 0x52:
      bVar1 = true;
      local_a8 = atoi(_optarg);
      break;
    case 0x53:
      entryPath.field_2._M_local_buf[0xb] = '\x01';
      break;
    case 0x61:
      local_131 = 1;
      outputFormat = atoi(_optarg);
      break;
    case 0x62:
      backupFile.field_2._M_local_buf[0xc] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_208,pcVar11,&local_209);
      std::__cxx11::string::operator=((string *)&value,local_208);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator(&local_209);
      break;
    case 99:
      local_a8 = atoi(_optarg);
      attributesProvided = true;
      break;
    case 100:
      extractDirectory.field_2._M_local_buf[0xf] = '\x01';
      break;
    case 0x65:
      entryPath.field_2._M_local_buf[8] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_158,pcVar11,&local_159);
      std::__cxx11::string::operator=((string *)&attributes,local_158);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
      break;
    case 0x66:
      entryPath.field_2._M_local_buf[9] = '\x01';
      break;
    case 0x68:
      usage();
      break;
    case 0x69:
      listPath.field_2._M_local_buf[0xb] = '\x01';
      break;
    case 0x6b:
      local_132 = 1;
      local_a8 = atoi(_optarg);
      break;
    case 0x6c:
      listPath.field_2._M_local_buf[10] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_190,pcVar11,&local_191);
      std::__cxx11::string::operator=((string *)&listCluster,local_190);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      break;
    case 0x6d:
      bVar3 = true;
      break;
    case 0x6f:
      backupFile.field_2._M_local_buf[0xd] = '\x01';
      break;
    case 0x70:
      backupFile.field_2._M_local_buf[0xb] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_230,pcVar11,&local_231);
      std::__cxx11::string::operator=((string *)&value,local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator(&local_231);
      break;
    case 0x72:
      readPath.field_2._M_local_buf[0xf] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b8,pcVar11,&local_1b9);
      std::__cxx11::string::operator=((string *)&cluster,local_1b8);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      break;
    case 0x73:
      listPath.field_2._12_4_ = atoi(_optarg);
      findEntry = true;
      break;
    case 0x74:
      entryPath.field_2._12_4_ = atoi(_optarg);
      break;
    case 0x76:
      bVar4 = true;
      _entry = atoi(_optarg);
      break;
    case 0x77:
      bVar2 = true;
      local_a8 = atoi(_optarg);
      break;
    case 0x78:
      extractDirectory.field_2._M_local_buf[0xe] = '\x01';
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1e0,pcVar11,&local_1e1);
      std::__cxx11::string::operator=(local_d0,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      break;
    case 0x7a:
      entryPath.field_2._M_local_buf[10] = '\x01';
    }
  }
  if (_optind != argc) {
    pcStack_38 = *(char **)(&(arguments.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                           (long)_optind * 8);
  }
  globalOffset._4_4_ = _optind;
  if (pcStack_38 == (char *)0x0) {
    usage();
    globalOffset._4_4_ = _optind;
  }
  while (globalOffset._4_4_ = globalOffset._4_4_ + 1, globalOffset._4_4_ < argc) {
    pcVar11 = *(char **)(&(arguments.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                        (long)globalOffset._4_4_ * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,pcVar11,(allocator<char> *)((long)&fat._outputFormat + 3));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&image,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fat._outputFormat + 3));
  }
  if (((((((((listPath.field_2._M_local_buf[0xb] & 1U) == 0) &&
           ((listPath.field_2._M_local_buf[10] & 1U) == 0)) && (!bVar5)) &&
         (((readPath.field_2._M_local_buf[0xf] & 1U) == 0 && (!bVar1)))) &&
        ((extractDirectory.field_2._M_local_buf[0xe] & 1U) == 0)) &&
       ((((backupFile.field_2._M_local_buf[0xf] & 1U) == 0 &&
         ((backupFile.field_2._M_local_buf[0xe] & 1U) == 0)) &&
        (((backupFile.field_2._M_local_buf[0xd] & 1U) == 0 &&
         ((((backupFile.field_2._M_local_buf[0xc] & 1U) == 0 &&
           ((backupFile.field_2._M_local_buf[0xb] & 1U) == 0)) && (!bVar2)))))))) &&
      ((!bVar3 && ((entryPath.field_2._M_local_buf[0xb] & 1U) == 0)))) &&
     (((entryPath.field_2._M_local_buf[10] & 1U) == 0 &&
      ((((entryPath.field_2._M_local_buf[8] & 1U) == 0 &&
        ((entryPath.field_2._M_local_buf[9] & 1U) == 0)) && ((local_132 & 1) == 0)))))) {
    usage();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,pcStack_38,
             (allocator<char> *)
             ((long)&path.parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  FatSystem::FatSystem((FatSystem *)local_3e0,&local_400,uStack_48,local_138);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&path.parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ctx = (EVP_PKEY_CTX *)(ulong)((byte)extractDirectory.field_2._M_local_buf[0xf] & 1);
  FatSystem::setListDeleted
            ((FatSystem *)local_3e0,SUB41((byte)extractDirectory.field_2._M_local_buf[0xf] & 1,0));
  uVar7 = FatSystem::init((FatSystem *)local_3e0,ctx);
  if ((uVar7 & 1) == 0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,"! Failed to init the FAT filesystem");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if ((listPath.field_2._M_local_buf[0xb] & 1U) == 0) {
    if ((listPath.field_2._M_local_buf[10] & 1U) == 0) {
      if (bVar5) {
        if (local_138 != Json) {
          poVar12 = std::operator<<((ostream *)&std::cout,"Listing cluster ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_78);
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        }
        FatSystem::list((FatSystem *)local_3e0,local_78);
      }
      else if ((readPath.field_2._M_local_buf[0xf] & 1U) == 0) {
        if (bVar1) {
          FatSystem::readFile((FatSystem *)local_3e0,local_a8,listPath.field_2._12_4_,(FILE *)0x0,
                              false);
        }
        else if ((extractDirectory.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((backupFile.field_2._M_local_buf[0xf] & 1U) == 0) {
            if ((backupFile.field_2._M_local_buf[0xe] & 1U) == 0) {
              if ((backupFile.field_2._M_local_buf[0xd] & 1U) == 0) {
                if ((entryPath.field_2._M_local_buf[9] & 1U) == 0) {
                  if ((local_132 & 1) == 0) {
                    if (((backupFile.field_2._M_local_buf[0xc] & 1U) == 0) &&
                       ((backupFile.field_2._M_local_buf[0xb] & 1U) == 0)) {
                      if (bVar2) {
                        if (!bVar4) {
                          diff_1.super_FatModule.system._6_1_ = 1;
                          this = (string *)__cxa_allocate_exception(0x20);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (this,"You should provide a value with -v",
                                     (allocator<char> *)((long)&diff_1.super_FatModule.system + 7));
                          diff_1.super_FatModule.system._6_1_ = 0;
                          __cxa_throw(this,&std::__cxx11::string::typeinfo,
                                      std::__cxx11::string::~string);
                        }
                        diff_1.super_FatModule.system._0_4_ =
                             FatSystem::nextCluster((FatSystem *)local_3e0,local_a8,0);
                        printf("Writing next cluster of %u from %u to %u\n",(ulong)local_a8,
                               (ulong)(uint)diff_1.super_FatModule.system);
                        FatSystem::enableWrite((FatSystem *)local_3e0);
                        if ((entryPath.field_2._12_4_ == 0) || (entryPath.field_2._12_4_ == 1)) {
                          printf("Writing on FAT1\n");
                          FatSystem::writeNextCluster((FatSystem *)local_3e0,local_a8,_entry,0);
                        }
                        if ((entryPath.field_2._12_4_ == 0) || (entryPath.field_2._12_4_ == 2)) {
                          printf("Writing on FAT2\n");
                          FatSystem::writeNextCluster((FatSystem *)local_3e0,local_a8,_entry,1);
                        }
                      }
                      else if (bVar3) {
                        FatDiff::FatDiff((FatDiff *)
                                         &path_2.parts.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (FatSystem *)local_3e0);
                        FatDiff::merge((FatDiff *)
                                       &path_2.parts.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      else if ((entryPath.field_2._M_local_buf[0xb] & 1U) == 0) {
                        if ((entryPath.field_2._M_local_buf[10] & 1U) == 0) {
                          if ((entryPath.field_2._M_local_buf[8] & 1U) != 0) {
                            poVar12 = std::operator<<((ostream *)&std::cout,"Searching entry for ");
                            poVar12 = std::operator<<(poVar12,(string *)&attributes);
                            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>)
                            ;
                            std::__cxx11::string::string
                                      ((string *)(entry_1.data.field_2._M_local_buf + 8),
                                       (string *)&attributes);
                            FatPath::FatPath((FatPath *)local_700,
                                             (string *)((long)&entry_1.data.field_2 + 8));
                            std::__cxx11::string::~string
                                      ((string *)(entry_1.data.field_2._M_local_buf + 8));
                            FatEntry::FatEntry((FatEntry *)local_7d0);
                            bVar5 = FatSystem::findFile((FatSystem *)local_3e0,(FatPath *)local_700,
                                                        (FatEntry *)local_7d0);
                            if (!bVar5) {
                              poVar12 = std::operator<<((ostream *)&std::cerr,"Entry not found.");
                              std::ostream::operator<<
                                        (poVar12,std::endl<char,std::char_traits<char>>);
                              exit(1);
                            }
                            printf("Entry address %016llx\n",entry_1.changeDate._16_8_);
                            printf("Attributes %02X\n",
                                   (ulong)(uint)(int)entry_1.longName.field_2._M_local_buf[8]);
                            poVar12 = std::operator<<((ostream *)&std::cout,"Found entry, cluster=")
                            ;
                            std::ostream::operator<<(poVar12,entry_1.longName.field_2._12_4_);
                            bVar5 = FatEntry::isDirectory((FatEntry *)local_7d0);
                            if (bVar5) {
                              std::operator<<((ostream *)&std::cout,", directory");
                            }
                            else {
                              poVar12 = std::operator<<((ostream *)&std::cout,", file with size=");
                              poVar12 = (ostream *)std::ostream::operator<<(poVar12,entry_1._64_8_);
                              poVar12 = std::operator<<(poVar12," (");
                              prettySize_abi_cxx11_
                                        ((string *)((long)&data.field_2 + 8),entry_1._64_8_);
                              poVar12 = std::operator<<(poVar12,(string *)
                                                                (data.field_2._M_local_buf + 8));
                              std::operator<<(poVar12,")");
                              std::__cxx11::string::~string
                                        ((string *)(data.field_2._M_local_buf + 8));
                            }
                            std::ostream::operator<<
                                      ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>)
                            ;
                            if ((attributesProvided & 1U) != 0) {
                              poVar12 = std::operator<<((ostream *)&std::cout,
                                                        "Setting the cluster to ");
                              poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_a8);
                              std::ostream::operator<<
                                        (poVar12,std::endl<char,std::char_traits<char>>);
                              entry_1.longName.field_2._12_4_ = local_a8;
                            }
                            if ((findEntry & 1U) != 0) {
                              poVar12 = std::operator<<((ostream *)&std::cout,"Setting the size to "
                                                       );
                              poVar12 = (ostream *)
                                        std::ostream::operator<<(poVar12,listPath.field_2._12_4_);
                              std::ostream::operator<<
                                        (poVar12,std::endl<char,std::char_traits<char>>);
                              entry_1._64_8_ = ZEXT48((uint)listPath.field_2._12_4_);
                            }
                            if ((local_131 & 1) != 0) {
                              poVar12 = std::operator<<((ostream *)&std::cout,
                                                        "Setting attributes to ");
                              poVar12 = (ostream *)std::ostream::operator<<(poVar12,outputFormat);
                              std::ostream::operator<<
                                        (poVar12,std::endl<char,std::char_traits<char>>);
                              entry_1.longName.field_2._M_local_buf[8] = (char)outputFormat;
                            }
                            if ((((attributesProvided & 1U) != 0) || ((findEntry & 1U) != 0)) ||
                               ((local_131 & 1) != 0)) {
                              FatEntry::updateData((FatEntry *)local_7d0);
                              FatSystem::enableWrite((FatSystem *)local_3e0);
                              std::__cxx11::string::string
                                        ((string *)(error.field_2._M_local_buf + 8),
                                         (string *)&entry_1.hasData);
                              pcVar11 = (char *)std::__cxx11::string::c_str();
                              iVar6 = std::__cxx11::string::size();
                              FatSystem::writeData
                                        ((FatSystem *)local_3e0,entry_1.changeDate._16_8_,pcVar11,
                                         iVar6);
                              std::__cxx11::string::~string
                                        ((string *)(error.field_2._M_local_buf + 8));
                            }
                            FatEntry::~FatEntry((FatEntry *)local_7d0);
                            FatPath::~FatPath((FatPath *)local_700);
                          }
                        }
                        else {
                          FatSystem::enableWrite((FatSystem *)local_3e0);
                          FatSystem::rewriteUnallocated((FatSystem *)local_3e0,false);
                        }
                      }
                      else {
                        FatSystem::enableWrite((FatSystem *)local_3e0);
                        FatSystem::rewriteUnallocated((FatSystem *)local_3e0,true);
                      }
                    }
                    else {
                      FatBackup::FatBackup(&local_678,(FatSystem *)local_3e0);
                      if ((backupFile.field_2._M_local_buf[0xc] & 1U) == 0) {
                        std::__cxx11::string::string((string *)&prev,(string *)&value);
                        FatBackup::patch(&local_678,(string *)&prev,entryPath.field_2._12_4_);
                        std::__cxx11::string::~string((string *)&prev);
                      }
                      else {
                        std::__cxx11::string::string((string *)&local_698,(string *)&value);
                        FatBackup::backup(&local_678,&local_698,entryPath.field_2._12_4_);
                        std::__cxx11::string::~string((string *)&local_698);
                      }
                    }
                  }
                  else {
                    FatSearch::FatSearch((FatSearch *)&backupSystem,(FatSystem *)local_3e0);
                    FatSearch::search((FatSearch *)&backupSystem,local_a8);
                  }
                }
                else {
                  FatFix::FatFix((FatFix *)&search.found,(FatSystem *)local_3e0);
                  FatFix::fix((FatFix *)&search.found);
                }
              }
              else {
                FatChains::FatChains
                          ((FatChains *)&fix.super_FatWalk.walkErased,(FatSystem *)local_3e0);
                FatChains::chainsAnalysis((FatChains *)&fix.super_FatWalk.walkErased);
                FatChains::~FatChains((FatChains *)&fix.super_FatWalk.walkErased);
              }
            }
            else {
              poVar12 = std::operator<<((ostream *)&std::cout,"Cluster ");
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_a8);
              poVar12 = std::operator<<(poVar12," address:");
              std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
              uVar9 = FatSystem::clusterAddress((FatSystem *)local_3e0,local_a8,false);
              printf("%llu (%016llx)\n",uVar9);
              poVar12 = std::operator<<((ostream *)&std::cout,"Next cluster:");
              std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
              uVar7 = FatSystem::nextCluster((FatSystem *)local_3e0,local_a8,0);
              uVar8 = FatSystem::nextCluster((FatSystem *)local_3e0,local_a8,1);
              printf("FAT1: %u (%08x)\n",(ulong)uVar7);
              printf("FAT2: %u (%08x)\n",(ulong)uVar8);
              chains_1.clusterToEntry._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
              FatChains::FatChains((FatChains *)&size_1,(FatSystem *)local_3e0);
              iVar6 = FatChains::chainSize
                                ((FatChains *)&size_1,local_a8,
                                 (bool *)((long)&chains_1.clusterToEntry._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count + 7));
              uVar9 = (long)iVar6 * fat.dataStart;
              prettySize_abi_cxx11_
                        ((string *)
                         &chains_2.clusterToEntry._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         uVar9);
              uVar10 = std::__cxx11::string::c_str();
              printf("Chain size: %llu (%llu / %s)\n",(long)iVar6,uVar9,uVar10);
              std::__cxx11::string::~string
                        ((string *)
                         &chains_2.clusterToEntry._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if ((chains_1.clusterToEntry._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ &
                  1) == 0) {
                printf("Chain is not contiguous\n");
              }
              else {
                printf("Chain is contiguous\n");
              }
              FatChains::~FatChains((FatChains *)&size_1);
            }
          }
          else {
            FatDiff::FatDiff((FatDiff *)&addr,(FatSystem *)local_3e0);
            FatDiff::compare((FatDiff *)&addr);
          }
        }
        else {
          FatExtract::FatExtract((FatExtract *)local_4f0,(FatSystem *)local_3e0);
          std::__cxx11::string::string((string *)&diff,local_d0);
          FatExtract::extract((FatExtract *)local_4f0,local_a8,(string *)&diff,
                              (bool)(extractDirectory.field_2._M_local_buf[0xf] & 1));
          std::__cxx11::string::~string((string *)&diff);
          FatExtract::~FatExtract((FatExtract *)local_4f0);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)(extract_1.targetDirectory.field_2._M_local_buf + 8),(string *)&cluster
                  );
        FatPath::FatPath((FatPath *)local_498,
                         (string *)((long)&extract_1.targetDirectory.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)(extract_1.targetDirectory.field_2._M_local_buf + 8));
        FatSystem::readFile((FatSystem *)local_3e0,(FatPath *)local_498,(FILE *)0x0);
        FatPath::~FatPath((FatPath *)local_498);
      }
    }
    else {
      if (local_138 != Json) {
        poVar12 = std::operator<<((ostream *)&std::cout,"Listing path ");
        poVar12 = std::operator<<(poVar12,(string *)&listCluster);
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::string
                ((string *)
                 &path_1.parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&listCluster);
      FatPath::FatPath((FatPath *)local_440,
                       (string *)
                       &path_1.parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &path_1.parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      FatSystem::list((FatSystem *)local_3e0,(FatPath *)local_440);
      FatPath::~FatPath((FatPath *)local_440);
    }
  }
  else {
    FatSystem::infos((FatSystem *)local_3e0);
  }
  FatSystem::~FatSystem((FatSystem *)local_3e0);
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    vector<string> arguments;
    char *image = NULL;
    int index;

    // -O offset
    unsigned long long globalOffset = 0;

    // -s, specify the size to be read
    unsigned int size = -1;

    // -i, display information about the disk
    bool infoFlag = false;

    // -l, list directories in the given path
    bool listFlag = false;
    string listPath;

    // -c, listing for a direct cluster
    bool listClusterFlag = false;
    unsigned int listCluster;

    // -r, reads a file
    bool readFlag = false;
    string readPath;

    // -R, reads from cluster file
    bool clusterRead = false;
    unsigned int cluster = 0;

    // -d, lists deleted
    bool listDeleted = false;

    // -x: extract
    bool extract = false;
    string extractDirectory;

    // -2: compare two fats
    bool compare = false;

    // -@: get the cluster address
    bool address = false;

    // -k: analysis the chains
    bool chains = false;

    // -b: backup the fats
    bool backup = false;
    bool patch = false;
    string backupFile;

    // -w: write next cluster
    bool writeNext = false;

    // -m: merge the FATs
    bool merge = false;

    // -v: value
    bool hasValue = false;
    unsigned int value;

    // -t: FAT table to write or read
    unsigned int table = 0;

    // -S: write random data in unallocated sectors
    bool scramble = false;
    bool zero = false;

    // -f: fix reachable
    bool fixReachable = false;

    // -e: entry hacking
    bool entry = false;
    string entryPath;
    bool clusterProvided = false;
    bool sizeProvided = false;
    int attributes = 0;
    bool attributesProvided = false;

    // -k: entry finder
    bool findEntry = false;
    OutputFormatType outputFormat = Default;

    // Parsing command line
    while ((index = getopt(argc, argv, "il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:")) != -1) {
        switch (index) {
        case 'a':
            attributesProvided = true;
            attributes = atoi(optarg);
            break;
        case 'k':
            findEntry = true;
            cluster = atoi(optarg);
            break;
        case 'f':
            fixReachable = true;
            break;
        case 'O':
            globalOffset = atoll(optarg);
            break;
        case 'e':
            entry = true;
            entryPath = string(optarg);
            break;
        case 'z':
            zero = true;
            break;
        case 'S':
            scramble = true;
            break;
        case 't':
            table = ATOU(optarg);
            break;
        case 'm':
            merge = true;
            break;
        case 'v':
            hasValue = true;
            value = ATOU(optarg);
            break;
        case 'w':
            writeNext = true;
            cluster = ATOU(optarg);
            break;
        case '@':
            address = true;
            cluster = ATOU(optarg);
            break;
        case 'o':
            chains = true;
            break;
        case 'i':
            infoFlag = true;
            break;
        case 'l':
            listFlag = true;
            listPath = string(optarg);
            break;
        case 'L':
            listClusterFlag = true;
            listCluster = ATOU(optarg);
            break;
        case 'r':
            readFlag = true;
            readPath = string(optarg);
            break;
        case 'R':
            clusterRead = true;
            cluster = ATOU(optarg);
            break;
        case 's':
            size = ATOU(optarg);
            sizeProvided = true;
            break;
        case 'd':
            listDeleted = true;
            break;
        case 'c':
            cluster = ATOU(optarg);
            clusterProvided = true;
            break;
        case 'x':
            extract = true;
            extractDirectory = string(optarg);
            break;
        case '2':
            compare = true;
            break;
        case 'b':
            backup = true;
            backupFile = string(optarg);
            break;
        case 'p':
            patch = true;
            backupFile = string(optarg);
            break;
        case 'h':
            usage();
            break;
        case 'F':
            if (strcmp(optarg, "json") == 0)
                outputFormat = Json;
            else if (strcmp(optarg, "default") == 0)
                outputFormat = Default;
            else
            {
                usage();
            }
            break;
        }
    }

    // Trying to get the FAT file or device
    if (optind != argc) {
        image = argv[optind];
    }

    if (!image) {
        usage();
    }

    // Getting extra arguments
    for (index=optind+1; index<argc; index++) {
        arguments.push_back(argv[index]);
    }

    // If the user did not required any actions
    if (!(infoFlag || listFlag || listClusterFlag || 
        readFlag || clusterRead || extract || compare || address ||
        chains || backup || patch || writeNext || merge ||
        scramble || zero || entry || fixReachable || findEntry)) {
        usage();
    }

    try {
        // Openning the image
        FatSystem fat(image, globalOffset, outputFormat);

        fat.setListDeleted(listDeleted);

        if (fat.init()) {
            if (infoFlag) {
                fat.infos();
            } else if (listFlag) {
                if (outputFormat != Json)
                    cout << "Listing path " << listPath << endl;
                FatPath path(listPath);
                fat.list(path);
            } else if (listClusterFlag) {
                if (outputFormat != Json)
                    cout << "Listing cluster " << listCluster << endl;
                fat.list(listCluster);
            } else if (readFlag) {
                FatPath path(readPath);
                fat.readFile(path);
            } else if (clusterRead) {
                fat.readFile(cluster, size);
            } else if (extract) {
                FatExtract extract(fat);
                extract.extract(cluster, extractDirectory, listDeleted);
            } else if (compare) {
                FatDiff diff(fat);
                diff.compare();
            } else if (address) {
                cout << "Cluster " << cluster << " address:" << endl;
                long long addr = fat.clusterAddress(cluster);
                printf("%llu (%016llx)\n", addr, addr);
                cout << "Next cluster:" << endl;
                int next1 = fat.nextCluster(cluster, 0);
                int next2 = fat.nextCluster(cluster, 1);
                printf("FAT1: %u (%08x)\n", next1, next1);
                printf("FAT2: %u (%08x)\n", next2, next2);
                bool isContiguous = false;

                FatChains chains(fat);
                unsigned long long size = chains.chainSize(cluster, &isContiguous);
                printf("Chain size: %llu (%llu / %s)\n", size, size*fat.bytesPerCluster, prettySize(size*fat.bytesPerCluster).c_str());
                if (isContiguous) {
                    printf("Chain is contiguous\n");
                } else {
                    printf("Chain is not contiguous\n");
                }
            } else if (chains) {
                FatChains chains(fat);
                chains.chainsAnalysis();
            } else if (fixReachable) {
                FatFix fix(fat);
                fix.fix();
            } else if (findEntry) {
                FatSearch search(fat);
                search.search(cluster);
            } else if (backup || patch) {
                FatBackup backupSystem(fat);
                
                if (backup) {
                    backupSystem.backup(backupFile, table);
                } else {
                    backupSystem.patch(backupFile, table);
                }
            } else if (writeNext) {
                if (!hasValue) {
                    throw string("You should provide a value with -v");
                }

                int prev = fat.nextCluster(cluster);
                printf("Writing next cluster of %u from %u to %u\n", cluster, prev, value);
                fat.enableWrite();

                if (table == 0 || table == 1) {
                    printf("Writing on FAT1\n");
                    fat.writeNextCluster(cluster, value, 0);
                } 
                if (table == 0 || table == 2) {
                    printf("Writing on FAT2\n");
                    fat.writeNextCluster(cluster, value, 1);
                } 
            } else if (merge) {
                FatDiff diff(fat);
                diff.merge();
            } else if (scramble) {
                fat.enableWrite();
                fat.rewriteUnallocated(1);
            } else if (zero) {
                fat.enableWrite();
                fat.rewriteUnallocated();
            } else if (entry) {
                cout << "Searching entry for " << entryPath << endl;
                FatPath path(entryPath);
                FatEntry entry;
                if (fat.findFile(path, entry)) {
                    printf("Entry address %016llx\n", entry.address);
                    printf("Attributes %02X\n", entry.attributes);
                    cout << "Found entry, cluster=" << entry.cluster;
                    if (entry.isDirectory()) {
                        cout << ", directory";
                    } else {
                        cout << ", file with size=" << entry.size << " (" << prettySize(entry.size) << ")";
                    }
                    cout << endl;

                    if (clusterProvided) {
                        cout << "Setting the cluster to " << cluster << endl;
                        entry.cluster = cluster;
                    }
                    if (sizeProvided) {
                        cout << "Setting the size to " << size << endl;
                        entry.size = size&0xffffffff;
                    }
                    if (attributesProvided) {
                        cout << "Setting attributes to " << attributes << endl;
                        entry.attributes = attributes;
                    }
                    if (clusterProvided || sizeProvided || attributesProvided) {
                        entry.updateData();
                        fat.enableWrite();
                        string data = entry.data;
                        fat.writeData(entry.address, data.c_str(), entry.data.size());
                    }
                } else {
                    cerr << "Entry not found." << endl;
                    exit(EXIT_FAILURE);
                }
            }
        } else {
            cerr << "! Failed to init the FAT filesystem" << endl;
            exit(EXIT_FAILURE);
        }
    } catch (string error) {
        cerr << "Error: " << error << endl;
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}